

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

Result __thiscall
httplib::ClientImpl::Get(ClientImpl *this,char *path,Headers *headers,Progress *progress)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  _Rb_tree_header *p_Var1;
  Error EVar2;
  undefined8 uVar3;
  size_t sVar4;
  Response *this_00;
  ssize_t sVar5;
  undefined8 extraout_RDX;
  int __flags;
  function<bool_(unsigned_long,_unsigned_long)> *in_R8;
  Result RVar6;
  Request req;
  undefined1 local_260 [72];
  _Rb_tree_node_base local_218;
  size_t local_1f8;
  _Alloc_hider local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  int local_1b0;
  _Alloc_hider local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Alloc_hider local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Rb_tree_node_base local_160;
  size_t local_140;
  _Rb_tree_node_base local_130;
  size_t local_110;
  pointer ppStack_108;
  pointer local_100;
  pointer ppStack_f8;
  pointer local_f0;
  pointer psStack_e8;
  pointer local_e0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_d8;
  size_t local_d0;
  undefined1 local_c8 [104];
  function<bool_(unsigned_long,_unsigned_long)> local_60;
  size_t local_38;
  
  local_260._0_8_ = local_260 + 0x10;
  local_260._8_8_ = 0;
  local_260[0x10] = '\0';
  local_260._32_8_ = local_260 + 0x30;
  local_260._40_8_ = (char *)0x0;
  local_260[0x30] = '\0';
  local_218._M_left = &local_218;
  local_218._M_color = _S_red;
  local_218._M_parent = (_Base_ptr)0x0;
  local_1f8 = 0;
  local_1f0._M_p = (pointer)&local_1e0;
  local_1e8 = 0;
  local_1e0._M_local_buf[0] = '\0';
  local_1d0._M_p = (pointer)&local_1c0;
  local_1c8 = 0;
  local_1c0._M_local_buf[0] = '\0';
  local_1b0 = -1;
  local_1a8._M_p = (pointer)&local_198;
  local_1a0 = 0;
  local_198._M_local_buf[0] = '\0';
  local_188._M_p = (pointer)&local_178;
  local_180 = 0;
  local_178._M_local_buf[0] = '\0';
  local_160._M_left = &local_160;
  local_160._M_color = _S_red;
  local_160._M_parent = (_Base_ptr)0x0;
  local_140 = 0;
  local_130._M_left = &local_130;
  local_130._M_color = _S_red;
  local_130._M_parent = (_Base_ptr)0x0;
  local_e0 = (pointer)0x0;
  _Stack_d8._M_current = (char *)0x0;
  local_f0 = (pointer)0x0;
  psStack_e8 = (pointer)0x0;
  local_100 = (pointer)0x0;
  ppStack_f8 = (pointer)0x0;
  local_110 = 0;
  ppStack_108 = (pointer)0x0;
  local_d0 = 0x14;
  local_38 = 0;
  local_218._M_right = local_218._M_left;
  local_160._M_right = local_160._M_left;
  local_130._M_right = local_130._M_left;
  memset(local_c8,0,0x88);
  std::__cxx11::string::_M_replace((ulong)local_260,0,(char *)0x0,0x12bc13);
  uVar3 = local_260._40_8_;
  sVar4 = strlen((char *)headers);
  __flags = (int)sVar4;
  std::__cxx11::string::_M_replace((ulong)(local_260 + 0x20),0,(char *)uVar3,(ulong)headers);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_260 + 0x40),
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(path + 0xb8));
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::
  _M_insert_range_equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)(local_260 + 0x40),(_Base_ptr)progress->_M_invoker,
             (_Base_ptr)((long)&(progress->super__Function_base)._M_functor + 8));
  std::function<bool_(unsigned_long,_unsigned_long)>::operator=(&local_60,in_R8);
  this_00 = (Response *)operator_new(0xe8);
  __s = &(this_00->version).field_2;
  memset(__s,0,0xd8);
  (this_00->version)._M_dataplus._M_p = (pointer)__s;
  (this_00->version)._M_string_length = 0;
  this_00->status = -1;
  (this_00->reason)._M_dataplus._M_p = (pointer)&(this_00->reason).field_2;
  p_Var1 = &(this_00->headers)._M_t._M_impl.super__Rb_tree_header;
  (this_00->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this_00->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this_00->body)._M_dataplus._M_p = (pointer)&(this_00->body).field_2;
  this_00->content_length_ = 0;
  *(undefined8 *)&(this_00->content_provider_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this_00->content_provider_).super__Function_base._M_functor + 8) = 0;
  (this_00->content_provider_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this_00->content_provider_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this_00->content_provider_resource_releaser_).super__Function_base._M_functor = 0
  ;
  *(undefined8 *)
   ((long)&(this_00->content_provider_resource_releaser_).super__Function_base._M_functor + 8) = 0;
  (this_00->content_provider_resource_releaser_).super__Function_base._M_manager =
       (_Manager_type)0x0;
  *(undefined8 *)
   ((long)&(this_00->content_provider_resource_releaser_).super__Function_base._M_manager + 1) = 0;
  *(undefined8 *)((long)&(this_00->content_provider_resource_releaser_)._M_invoker + 1) = 0;
  sVar5 = send((ClientImpl *)path,(int)local_260,this_00,(size_t)headers,__flags);
  EVar2 = *(Error *)(path + 8);
  if ((char)sVar5 == '\0') {
    this->_vptr_ClientImpl = (_func_int **)0x0;
    this->error_ = EVar2;
    Response::~Response(this_00);
    operator_delete(this_00);
  }
  else {
    this->_vptr_ClientImpl = (_func_int **)this_00;
    this->error_ = EVar2;
  }
  Request::~Request((Request *)local_260);
  RVar6._8_8_ = extraout_RDX;
  RVar6.res_._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>.
  _M_t.super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)this;
  return RVar6;
}

Assistant:

inline Result ClientImpl::Get(const char *path, const Headers &headers,
                              Progress progress) {
  Request req;
  req.method = "GET";
  req.path = path;
  req.headers = default_headers_;
  req.headers.insert(headers.begin(), headers.end());
  req.progress = std::move(progress);

  auto res = detail::make_unique<Response>();
  auto ret = send(req, *res);
  return Result{ret ? std::move(res) : nullptr, get_last_error()};
}